

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O3

int lws_wsi_mux_mark_parents_needing_writeable(lws *wsi)

{
  undefined8 in_RAX;
  lws *wsi2;
  
  if (wsi != (lws *)0x0) {
    do {
      (wsi->mux).requested_POLLOUT = '\x01';
      in_RAX = CONCAT44((int)((ulong)in_RAX >> 0x20),(wsi->mux).my_sid);
      _lws_log_cx((wsi->lc).log_cx,lws_log_prepend_wsi,wsi,8,
                  "lws_wsi_mux_mark_parents_needing_writeable","sid %u, pending writable",in_RAX);
      wsi = (wsi->mux).parent_wsi;
    } while (wsi != (lws *)0x0);
  }
  return 0;
}

Assistant:

int
lws_wsi_mux_mark_parents_needing_writeable(struct lws *wsi)
{
	struct lws /* *network_wsi = lws_get_network_wsi(wsi), */ *wsi2;
	//int already = network_wsi->mux.requested_POLLOUT;

	/* mark everybody above him as requesting pollout */

	wsi2 = wsi;
	while (wsi2) {
		wsi2->mux.requested_POLLOUT = 1;
		lwsl_wsi_info(wsi2, "sid %u, pending writable",
							wsi2->mux.my_sid);
		wsi2 = wsi2->mux.parent_wsi;
	}

	return 0; // already;
}